

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void duckdb::roaring::RoaringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  ContainerScanState *pCVar1;
  RoaringScanState scan_state;
  RoaringScanState local_e8;
  
  RoaringScanState::RoaringScanState(&local_e8,segment);
  pCVar1 = RoaringScanState::LoadContainer
                     (&local_e8,(ulong)row_id >> 0xb,(ulong)((uint)row_id & 0x7ff));
  (*pCVar1->_vptr_ContainerScanState[2])(pCVar1,result,result_idx,1);
  local_e8.super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__RoaringScanState_02444838;
  if (local_e8.data_start_position.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data_start_position.
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.container_metadata.
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.container_metadata.
                    super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                    .
                    super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.metadata_collection.cardinality.
      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.metadata_collection.cardinality.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.metadata_collection.number_of_runs.
      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.metadata_collection.number_of_runs.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.metadata_collection.container_type.
      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.metadata_collection.container_type.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.current_container.
      super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
      .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_e8.current_container.
        super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
        .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl)[1])();
  }
  local_e8.current_container.
  super_unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::ContainerScanState_*,_std::default_delete<duckdb::roaring::ContainerScanState>_>
  .super__Head_base<0UL,_duckdb::roaring::ContainerScanState_*,_false>._M_head_impl =
       (unique_ptr<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>_>
        )(__uniq_ptr_data<duckdb::roaring::ContainerScanState,_std::default_delete<duckdb::roaring::ContainerScanState>,_true,_true>
          )0x0;
  BufferHandle::~BufferHandle(&local_e8.handle);
  return;
}

Assistant:

void RoaringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result, idx_t result_idx) {
	RoaringScanState scan_state(segment);

	idx_t internal_offset;
	idx_t container_idx = scan_state.GetContainerIndex(static_cast<idx_t>(row_id), internal_offset);
	auto &container_state = scan_state.LoadContainer(container_idx, internal_offset);

	scan_state.ScanInternal(container_state, 1, result, result_idx);
}